

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::packageHoistedValue
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HoistedVal *hoisted,
          size_t sizeHint)

{
  Index index;
  bool bVar1;
  ScopeCtx *pSVar2;
  reference ppEVar3;
  size_t sVar4;
  TupleExtract *pTVar5;
  Type *pTVar6;
  uint *puVar7;
  LocalSet *tuple;
  LocalGet *tuple_00;
  Ok local_119;
  uintptr_t local_118;
  uint local_110;
  uint local_10c;
  Index size;
  Index i;
  uint local_fc;
  Err local_f8;
  Err *local_d8;
  Err *err;
  undefined1 local_c0 [8];
  Result<unsigned_int> _val;
  undefined1 local_90 [8];
  Result<unsigned_int> scratch;
  uint local_60;
  Ok local_59;
  Index scratchIdx;
  Type local_50;
  Type type;
  anon_class_24_3_cfa6b6c1 packageAsBlock;
  ScopeCtx *scope;
  size_t sizeHint_local;
  HoistedVal *hoisted_local;
  IRBuilder *this_local;
  
  pSVar2 = getScope(this);
  bVar1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                    (&pSVar2->exprStack);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!scope.exprStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                  ,0x62,"Result<> wasm::IRBuilder::packageHoistedValue(const HoistedVal &, size_t)")
    ;
  }
  type.id = (uintptr_t)this;
  ppEVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::back
                      (&pSVar2->exprStack);
  local_50.id = ((*ppEVar3)->type).id;
  sVar4 = wasm::Type::size(&local_50);
  if ((sVar4 == sizeHint) || (sVar4 = wasm::Type::size(&local_50), sVar4 < 2)) {
    if (hoisted->get != (LocalGet *)0x0) {
      _scratchIdx = local_50.id;
      packageHoistedValue::anon_class_24_3_cfa6b6c1::operator()
                ((anon_class_24_3_cfa6b6c1 *)&type,local_50);
    }
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_59);
  }
  else {
    if (hoisted->get == (LocalGet *)0x0) {
      _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = local_50.id;
      addScratchLocal((Result<unsigned_int> *)local_90,this,local_50);
      Result<unsigned_int>::Result
                ((Result<unsigned_int> *)local_c0,(Result<unsigned_int> *)local_90);
      local_d8 = Result<unsigned_int>::getErr((Result<unsigned_int> *)local_c0);
      bVar1 = local_d8 != (Err *)0x0;
      if (bVar1) {
        wasm::Err::Err(&local_f8,local_d8);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_f8);
        wasm::Err::~Err(&local_f8);
      }
      local_fc = (uint)bVar1;
      Result<unsigned_int>::~Result((Result<unsigned_int> *)local_c0);
      if (local_fc == 0) {
        puVar7 = Result<unsigned_int>::operator*((Result<unsigned_int> *)local_90);
        index = *puVar7;
        ppEVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::back
                            (&pSVar2->exprStack);
        _size = local_50.id;
        tuple = Builder::makeLocalTee(&this->builder,index,*ppEVar3,local_50);
        pTVar5 = Builder::makeTupleExtract(&this->builder,(Expression *)tuple,0);
        ppEVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::back
                            (&pSVar2->exprStack);
        *ppEVar3 = (value_type)pTVar5;
        puVar7 = Result<unsigned_int>::operator*((Result<unsigned_int> *)local_90);
        local_60 = *puVar7;
        local_fc = 0;
      }
      Result<unsigned_int>::~Result((Result<unsigned_int> *)local_90);
      if (local_fc != 0) {
        return __return_storage_ptr__;
      }
    }
    else {
      pTVar5 = Builder::makeTupleExtract(&this->builder,(Expression *)hoisted->get,0);
      ppEVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::back
                          (&pSVar2->exprStack);
      *ppEVar3 = (value_type)pTVar5;
      pTVar6 = wasm::Type::operator[](&local_50,0);
      scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = pTVar6->id;
      packageHoistedValue::anon_class_24_3_cfa6b6c1::operator()
                ((anon_class_24_3_cfa6b6c1 *)&type,
                 (Type)scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_);
      local_60 = hoisted->get->index;
    }
    local_10c = 1;
    sVar4 = wasm::Type::size(&local_50);
    local_110 = (uint)sVar4;
    for (; local_10c < local_110; local_10c = local_10c + 1) {
      local_118 = local_50.id;
      tuple_00 = Builder::makeLocalGet(&this->builder,local_60,local_50);
      pTVar5 = Builder::makeTupleExtract(&this->builder,(Expression *)tuple_00,local_10c);
      push(this,(Expression *)pTVar5);
    }
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_119);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::packageHoistedValue(const HoistedVal& hoisted,
                                        size_t sizeHint) {
  auto& scope = getScope();
  assert(!scope.exprStack.empty());

  auto packageAsBlock = [&](Type type) {
    // Create a block containing the producer of the hoisted value, the final
    // get of the hoisted value, and everything in between. Record the fact that
    // we are synthesizing a block to help us determine later whether we need to
    // run the nested pop fixup.
    scopeStack[0].noteSyntheticBlock();
    std::vector<Expression*> exprs(scope.exprStack.begin() + hoisted.valIndex,
                                   scope.exprStack.end());
    auto* block = builder.makeBlock(exprs, type);
    scope.exprStack.resize(hoisted.valIndex);
    push(block);
  };

  auto type = scope.exprStack.back()->type;

  if (type.size() == sizeHint || type.size() <= 1) {
    if (hoisted.get) {
      packageAsBlock(type);
    }
    return Ok{};
  }

  // We need to break up the hoisted tuple. Create and push an expression
  // setting the tuple to a local and returning its first element, then push
  // additional gets of each of its subsequent elements. Reuse the scratch local
  // we used for hoisting, if it exists.
  Index scratchIdx;
  if (hoisted.get) {
    // Update the get on top of the stack to just return the first element.
    scope.exprStack.back() = builder.makeTupleExtract(hoisted.get, 0);
    packageAsBlock(type[0]);
    scratchIdx = hoisted.get->index;
  } else {
    auto scratch = addScratchLocal(type);
    CHECK_ERR(scratch);
    scope.exprStack.back() = builder.makeTupleExtract(
      builder.makeLocalTee(*scratch, scope.exprStack.back(), type), 0);
    scratchIdx = *scratch;
  }
  for (Index i = 1, size = type.size(); i < size; ++i) {
    push(builder.makeTupleExtract(builder.makeLocalGet(scratchIdx, type), i));
  }
  return Ok{};
}